

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void is_long_long_test(void)

{
  ostream *poVar1;
  bool in_DL;
  bool v;
  bool v_00;
  bool v_01;
  bool v_02;
  bool v_03;
  bool v_04;
  bool v_05;
  bool v_06;
  bool v_07;
  bool v_08;
  bool v_09;
  
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x211e93,(char *)0x1,in_DL);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x211e9d,(char *)0x0,v);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"-12312312",(char *)0x1,v_00);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"-12312312.34",(char *)0x0,v_01);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"1e2",(char *)0x0,v_02);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"9223372036854775807",(char *)0x1,v_03);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x211ec2,(char *)0x0,v_04);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"-9223372036854775808",(char *)0x1,v_05);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"-9223372036854775809",(char *)0x0,v_06);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"123123123123123123123123123123123123",(char *)0x0,v_07);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(anon_var_dwarf_60e6 + 5),(char *)0x0,v_08);
  is_long_long_test::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"0123",(char *)0x0,v_09);
  poVar1 = std::operator<<((ostream *)&std::cout,"done");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
is_long_long_test()
{
    auto check = [](char const* s, bool v) {
        if (QUtil::is_long_long(s) != v) {
            std::cout << "failed: " << s << std::endl;
        }
    };
    check("12312312", true);
    check("12312312.34", false);
    check("-12312312", true);
    check("-12312312.34", false);
    check("1e2", false);
    check("9223372036854775807", true);
    check("9223372036854775808", false);
    check("-9223372036854775808", true);
    check("-9223372036854775809", false);
    check("123123123123123123123123123123123123", false);
    check("potato", false);
    check("0123", false);
    std::cout << "done" << std::endl;
}